

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall nite::Font::load(Font *this,string *path,uint size,float thickness)

{
  Vec2 VVar1;
  FT_Face_conflict library_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar2;
  bool bVar3;
  FT_Error FVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  nite *this_00;
  reference pvVar8;
  uint *puVar9;
  ulong uVar10;
  size_type sVar11;
  FT_Face *aface;
  uint number;
  int number_00;
  int number_01;
  int number_02;
  uint number_03;
  FT_Glyph local_540;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  Single *local_448;
  value_type *frag;
  GLuint local_438;
  int i_1;
  GLuint atlas;
  FT_BitmapGlyph biggest;
  uchar *puStack_420;
  uchar *local_418;
  FT_BitmapGlyph local_410;
  uchar *puStack_408;
  uchar *local_400;
  FT_BitmapGlyph pFStack_3f8;
  Single buffer;
  FT_Glyph local_3d8;
  FT_BitmapGlyph bitmapStroke;
  FT_BitmapGlyph bitmap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  FT_Glyph local_1e8;
  FT_Glyph stroke;
  FT_Glyph glyph;
  int local_1d0;
  FT_UInt cindex;
  int i;
  int xcursor;
  Vec2 dims;
  vector<Single,_std::allocator<Single>_> frags;
  FT_Stroker stroker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  reference local_160;
  fontT *proxy;
  Font *local_150;
  undefined1 local_148 [8];
  string fileHash;
  undefined1 local_108 [8];
  string pathAndSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string filename;
  FT_Face_conflict face;
  FT_Library library;
  float thickness_local;
  uint size_local;
  string *path_local;
  Font *this_local;
  
  library._0_4_ = thickness;
  library._4_4_ = size;
  _thickness_local = path;
  path_local = (string *)this;
  std::__cxx11::string::string((string *)local_50,(string *)path);
  this->ln = -1.0;
  bVar3 = fileExists((string *)local_50);
  if (bVar3) {
    FVar4 = FT_Init_FreeType((FT_Library *)&face);
    library_00 = face;
    if (FVar4 == 0) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      aface = (FT_Face *)((long)&filename.field_2 + 8);
      FVar4 = FT_New_Face((FT_Library)library_00,pcVar7,0,aface);
      if (FVar4 == 0) {
        unload(this);
        __lhs = _thickness_local;
        toStr_abi_cxx11_((string *)((long)&fileHash.field_2 + 8),(nite *)(ulong)library._4_4_,number
                        );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileHash.field_2 + 8));
        std::__cxx11::string::~string((string *)(fileHash.field_2._M_local_buf + 8));
        this_00 = (nite *)std::__cxx11::string::c_str();
        pcVar7 = (char *)std::__cxx11::string::size();
        hashMemory_abi_cxx11_((string *)local_148,this_00,pcVar7,(size_t)aface);
        iVar5 = getSlotByHash((string *)local_148);
        this->objectId = iVar5;
        if ((uint)this->objectId < 0x80000000) {
          pvVar8 = std::vector<fontT,_std::allocator<fontT>_>::operator[]
                             (&fontList,(long)this->objectId);
          proxy = (fontT *)this;
          std::vector<nite::Font_*,_std::allocator<nite::Font_*>_>::push_back
                    (&pvVar8->owners,(value_type *)&proxy);
          local_a4 = 1;
        }
        else {
          uVar6 = getEmptySlot();
          this->objectId = uVar6;
          pvVar8 = std::vector<fontT,_std::allocator<fontT>_>::operator[]
                             (&fontList,(long)this->objectId);
          pvVar8->empty = false;
          pvVar8 = std::vector<fontT,_std::allocator<fontT>_>::operator[]
                             (&fontList,(long)this->objectId);
          local_150 = this;
          std::vector<nite::Font_*,_std::allocator<nite::Font_*>_>::push_back
                    (&pvVar8->owners,&local_150);
          pvVar8 = std::vector<fontT,_std::allocator<fontT>_>::operator[]
                             (&fontList,(long)this->objectId);
          std::__cxx11::string::operator=((string *)&pvVar8->hash,(string *)local_148);
          psVar2 = _thickness_local;
          pvVar8 = std::vector<fontT,_std::allocator<fontT>_>::operator[]
                             (&fontList,(long)this->objectId);
          std::__cxx11::string::operator=((string *)&pvVar8->filename,(string *)psVar2);
          local_160 = std::vector<fontT,_std::allocator<fontT>_>::operator[]
                                (&fontList,(long)this->objectId);
          FVar4 = FT_Set_Char_Size((FT_Face)filename.field_2._8_8_,(ulong)(library._4_4_ << 6),
                                   (ulong)(library._4_4_ << 6),0x60,0x60);
          if (FVar4 == 0) {
            if (0.0 < library._0_4_) {
              FT_Stroker_New((FT_Library)face,
                             (FT_Stroker *)
                             &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              FT_Stroker_Set((FT_Stroker)
                             frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                             (long)(int)(library._0_4_ * 64.0),FT_STROKER_LINECAP_ROUND,
                             FT_STROKER_LINEJOIN_ROUND,0);
            }
            std::vector<Single,_std::allocator<Single>_>::vector
                      ((vector<Single,_std::allocator<Single>_> *)&dims);
            Vec2::Vec2((Vec2 *)&i);
            cindex = 0;
            for (local_1d0 = 0x20; local_1d0 < 0x80; local_1d0 = local_1d0 + 1) {
              glyph._4_4_ = FT_Get_Char_Index((FT_Face)filename.field_2._8_8_,(long)local_1d0);
              FVar4 = FT_Load_Glyph((FT_Face)filename.field_2._8_8_,glyph._4_4_,0);
              if (FVar4 == 0) {
                FVar4 = FT_Get_Glyph(*(FT_GlyphSlot *)(filename.field_2._8_8_ + 0x98),&stroke);
                if (FVar4 == 0) {
                  if (0.0 < library._0_4_) {
                    FVar4 = FT_Get_Glyph(*(FT_GlyphSlot *)(filename.field_2._8_8_ + 0x98),&local_1e8
                                        );
                    if (FVar4 != 0) {
                      toStr_abi_cxx11_((string *)&bitmap,(nite *)(ulong)(uint)(int)(char)local_1d0,
                                       number_02);
                      std::operator+(&local_3a8,"failed to load char \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&bitmap);
                      std::operator+(&local_388,&local_3a8,"\' for font \'");
                      std::operator+(&local_368,&local_388,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_50);
                      std::operator+(&local_348,&local_368,"\'");
                      print(&local_348);
                      std::__cxx11::string::~string((string *)&local_348);
                      std::__cxx11::string::~string((string *)&local_368);
                      std::__cxx11::string::~string((string *)&local_388);
                      std::__cxx11::string::~string((string *)&local_3a8);
                      std::__cxx11::string::~string((string *)&bitmap);
                      goto LAB_002439b3;
                    }
                    FT_Glyph_StrokeBorder
                              (&local_1e8,
                               (FT_Stroker)
                               frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,'\0','\x01');
                  }
                  FT_Glyph_To_Bitmap(&stroke,FT_RENDER_MODE_NORMAL,(FT_Vector *)0x0,'\x01');
                  local_540 = stroke;
                  if (0.0 < library._0_4_) {
                    FT_Glyph_To_Bitmap(&local_1e8,FT_RENDER_MODE_NORMAL,(FT_Vector *)0x0,'\x01');
                    local_3d8 = local_1e8;
                  }
                  Single::Single((Single *)&pFStack_3f8);
                  if ((library._0_4_ != 0.0) || (NAN(library._0_4_))) {
                    Single::Single((Single *)&biggest);
                    buffer.buffer = local_418;
                    pFStack_3f8 = biggest;
                    buffer._0_8_ = puStack_420;
                    Single::strong((Single *)&pFStack_3f8,*(int *)((long)&local_3d8[1].clazz + 4),
                                   *(int *)&local_3d8[1].clazz,(uchar *)local_3d8[1].advance.x);
                    Single::blitz((Single *)&pFStack_3f8,*(int *)((long)&local_540[1].clazz + 4),
                                  *(int *)&local_540[1].clazz,(uchar *)local_540[1].advance.x);
                  }
                  else {
                    Single::Single((Single *)&local_410);
                    buffer.buffer = local_400;
                    pFStack_3f8 = local_410;
                    buffer._0_8_ = puStack_408;
                    Single::pure((Single *)&pFStack_3f8,*(int *)((long)&local_540[1].clazz + 4),
                                 *(int *)&local_540[1].clazz,(uchar *)local_540[1].advance.x);
                  }
                  std::vector<Single,_std::allocator<Single>_>::push_back
                            ((vector<Single,_std::allocator<Single>_> *)&dims,
                             (value_type *)&pFStack_3f8);
                  if ((library._0_4_ != 0.0) || (NAN(library._0_4_))) {
                    local_540 = local_3d8;
                  }
                  else {
                  }
                  _atlas = local_540;
                  local_160->glyphs[local_1d0].index.x = (float)(int)cindex;
                  local_160->glyphs[local_1d0].index.y = 0.0;
                  local_160->glyphs[local_1d0].coors.x =
                       (float)*(uint *)((long)&local_540[1].clazz + 4);
                  local_160->glyphs[local_1d0].coors.y = (float)*(uint *)&local_540[1].clazz;
                  local_160->glyphs[local_1d0].orig.x = (float)*(int *)&local_540[1].library;
                  local_160->glyphs[local_1d0].orig.y =
                       (float)*(int *)((long)&local_540[1].library + 4);
                  local_160->glyphs[local_1d0].size.x =
                       (float)(*(long *)(*(long *)(filename.field_2._8_8_ + 0x98) + 0x80) >> 6);
                  local_160->glyphs[local_1d0].size.y =
                       (float)(*(long *)(*(long *)(filename.field_2._8_8_ + 0x98) + 0x48) >> 6);
                  i = (int)((float)i + (float)(*(int *)((long)&local_540[1].clazz + 4) + 2));
                  i_1 = (int)(long)(float)xcursor;
                  puVar9 = std::max<unsigned_int>((uint *)&i_1,(uint *)&local_540[1].clazz);
                  xcursor = (int)(float)*puVar9;
                  cindex = *(int *)((long)&_atlas[1].clazz + 4) + 2 + cindex;
                  FT_Done_Glyph(stroke);
                  if (0.0 < library._0_4_) {
                    FT_Done_Glyph(local_1e8);
                  }
                }
                else {
                  toStr_abi_cxx11_(&local_328,(nite *)(ulong)(uint)(int)(char)local_1d0,number_01);
                  std::operator+(&local_308,"failed to load char \'",&local_328);
                  std::operator+(&local_2e8,&local_308,"\' for font \'");
                  std::operator+(&local_2c8,&local_2e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50);
                  std::operator+(&local_2a8,&local_2c8,"\'");
                  print(&local_2a8);
                  std::__cxx11::string::~string((string *)&local_2a8);
                  std::__cxx11::string::~string((string *)&local_2c8);
                  std::__cxx11::string::~string((string *)&local_2e8);
                  std::__cxx11::string::~string((string *)&local_308);
                  std::__cxx11::string::~string((string *)&local_328);
                }
              }
              else {
                toStr_abi_cxx11_(&local_288,(nite *)(ulong)(uint)(int)(char)local_1d0,number_00);
                std::operator+(&local_268,"failed to load char \'",&local_288);
                std::operator+(&local_248,&local_268,"\' for font \'");
                std::operator+(&local_228,&local_248,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50);
                std::operator+(&local_208,&local_228,"\'");
                print(&local_208);
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::string::~string((string *)&local_248);
                std::__cxx11::string::~string((string *)&local_268);
                std::__cxx11::string::~string((string *)&local_288);
              }
LAB_002439b3:
            }
            local_160->vertAdvance =
                 (float)(*(long *)(*(long *)(filename.field_2._8_8_ + 0xa0) + 0x40) >> 6);
            glEnable(0xde1);
            glGenTextures(1,&local_438);
            glBindTexture(0xde1,local_438);
            glPixelStorei(0xcf5,1);
            glTexParameteri(0xde1,0x2800,0x2601);
            glTexParameteri(0xde1,0x2801,0x2601);
            glTexImage2D(0xde1,0,0x1908,(int)(float)i,(int)(float)xcursor,0,0x1908,0x1401,0);
            cindex = 0;
            for (frag._4_4_ = 0; uVar10 = (ulong)frag._4_4_,
                sVar11 = std::vector<Single,_std::allocator<Single>_>::size
                                   ((vector<Single,_std::allocator<Single>_> *)&dims),
                uVar10 < sVar11; frag._4_4_ = frag._4_4_ + 1) {
              local_448 = std::vector<Single,_std::allocator<Single>_>::operator[]
                                    ((vector<Single,_std::allocator<Single>_> *)&dims,
                                     (long)frag._4_4_);
              glTexSubImage2D(0xde1,0,cindex,0,local_448->w,local_448->h,0x1908,0x1401,
                              local_448->buffer);
              cindex = local_448->w + 2 + cindex;
              Single::clear(local_448);
            }
            glPixelStorei(0xcf5,4);
            std::__cxx11::string::operator=((string *)&local_160->hash,(string *)local_148);
            VVar1.y = (float)xcursor;
            VVar1.x = (float)i;
            local_160->atlasSize = VVar1;
            std::__cxx11::string::operator=((string *)&local_160->path,(string *)_thickness_local);
            local_160->size = library._4_4_;
            local_160->empty = false;
            local_160->atlas = local_438;
            std::operator+(&local_4a8,"loaded font \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50);
            std::operator+(&local_488,&local_4a8,"\' size: ");
            toStr_abi_cxx11_(&local_4c8,(nite *)(ulong)library._4_4_,number_03);
            std::operator+(&local_468,&local_488,&local_4c8);
            print(&local_468);
            std::__cxx11::string::~string((string *)&local_468);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_4a8);
            if (0.0 < library._0_4_) {
              FT_Stroker_Done((FT_Stroker)
                              frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
            }
            FT_Done_Face((FT_Face)filename.field_2._8_8_);
            FT_Done_FreeType((FT_Library)face);
            std::vector<Single,_std::allocator<Single>_>::~vector
                      ((vector<Single,_std::allocator<Single>_> *)&dims);
            local_a4 = 0;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stroker,"failure loading font \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50);
            std::operator+(&local_180,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stroker,"\': FT_New_Face");
            print(&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&stroker);
            FT_Done_FreeType((FT_Library)face);
            local_a4 = 1;
          }
        }
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)local_108);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pathAndSize.field_2 + 8),"failure loading font \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        std::operator+(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pathAndSize.field_2 + 8),"\': FT_New_Face");
        print(&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)(pathAndSize.field_2._M_local_buf + 8));
        FT_Done_FreeType((FT_Library)face);
        local_a4 = 1;
      }
    }
    else {
      print("failure starting FreeType: FT_Init_FreeType");
      local_a4 = 1;
    }
  }
  else {
    std::operator+(&local_a0,"couldn\'t load font \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_80,&local_a0,"\': doesn\'t exist");
    print(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    local_a4 = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void nite::Font::load(const String &path, unsigned size, float thickness){
	FT_Library library;
	FT_Face face;
	String filename = path;
	size *= SCALING;
	ln = -1.0f;

	if(!nite::fileExists(filename)){
		nite::print("couldn't load font '"+filename+"': doesn't exist");
		return;
	}

	if(FT_Init_FreeType(&library)){
		nite::print("failure starting FreeType: FT_Init_FreeType");
		return;
	}

	if(FT_New_Face(library, filename.c_str(), 0, &face)) {
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);
		return;
	}	

	unload();
	String pathAndSize = path+nite::toStr(size);
	String fileHash = nite::hashMemory((char*)pathAndSize.c_str(), pathAndSize.size());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		fontList[objectId].empty = false;
		fontList[objectId].owners.push_back(this);
		fontList[objectId].hash = fileHash;
    	fontList[objectId].filename = path;
	}else{
		fontList[objectId].owners.push_back(this);
		return;
	}
	fontT &proxy = fontList[objectId];


	if(FT_Set_Char_Size(face, size << 6, size << 6, 96, 96)){
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);		
		return;
	}

	FT_Stroker stroker;
	if(thickness > 0.0f){
		FT_Stroker_New(library, &stroker);
		FT_Stroker_Set(stroker, (int)(thickness * 64.0f), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
	}
	Vector<Single> frags; // maybe a vector could be too slow?
	nite::Vec2 dims;
	int xcursor = 0.0f;
	// render characters
	for(int i = ASCII_MIN; i < ASCII_MAX; i++){
		FT_UInt cindex = FT_Get_Char_Index(face, i);
		FT_Glyph glyph, stroke;
		if(FT_Load_Glyph(face, cindex, FT_LOAD_DEFAULT)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(FT_Get_Glyph(face->glyph, &glyph)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(thickness > 0.0f){
			if(FT_Get_Glyph(face->glyph, &stroke)){
				nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
				continue;
			}		
			// stroke
			FT_Glyph_StrokeBorder(&stroke, stroker, 0, 1);			
		}
		// render to bitmap
		FT_Glyph_To_Bitmap(&glyph, FT_RENDER_MODE_NORMAL, NULL, true);
		FT_BitmapGlyph bitmap = reinterpret_cast<FT_BitmapGlyph>(glyph);
		FT_BitmapGlyph bitmapStroke;
		if(thickness > 0.0f){
			FT_Glyph_To_Bitmap(&stroke, FT_RENDER_MODE_NORMAL, NULL, true);
			bitmapStroke = reinterpret_cast<FT_BitmapGlyph>(stroke);
		}
		
		Single buffer;

		// render filler alone
		if(thickness == 0.0f){
			buffer = Single();
			buffer.pure(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);
		// render outline as a strong and blit on it the filler
		}else{
			buffer = Single();
			buffer.strong(bitmapStroke->bitmap.width, bitmapStroke->bitmap.rows, bitmapStroke->bitmap.buffer);
			buffer.blitz(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);		
		}

		frags.push_back(buffer);
		auto biggest = thickness == 0.0f ? bitmap : bitmapStroke;

		// metrics
		proxy.glyphs[i].index.x = xcursor;
		proxy.glyphs[i].index.y = 0;
		proxy.glyphs[i].coors.x = biggest->bitmap.width;
		proxy.glyphs[i].coors.y = biggest->bitmap.rows;
		proxy.glyphs[i].orig.x = biggest->left;
		proxy.glyphs[i].orig.y = biggest->top; 
		proxy.glyphs[i].size.x = face->glyph->advance.x >> 6;
		proxy.glyphs[i].size.y = face->glyph->metrics.horiBearingY >> 6;
		// atlas info
		dims.x += biggest->bitmap.width + 2;
		dims.y = std::max((unsigned)dims.y, biggest->bitmap.rows);
		// cursor update
		xcursor += biggest->bitmap.width + 2;
		FT_Done_Glyph(glyph);
		if(thickness > 0.0f){
			FT_Done_Glyph(stroke);
		}
	}
	proxy.vertAdvance = face->size->metrics.height >> 6;

	// compose atlas
	// TODO: might use a more complex algorithm than just a very long texture
	// specially if we ever get to implement unicode
	GLuint atlas;
	glEnable(GL_TEXTURE_2D);
	glGenTextures(1, &atlas);
	glBindTexture(GL_TEXTURE_2D, atlas);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);	
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, dims.x, dims.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);	
	xcursor = 0;
	for(int i = 0; i < frags.size(); ++i){
		auto &frag = frags[i];
		glTexSubImage2D(GL_TEXTURE_2D, 0, xcursor, 0, frag.w, frag.h, GL_RGBA, GL_UNSIGNED_BYTE, frag.buffer);
		xcursor += frag.w + 2;
		frag.clear();
	}
	glPixelStorei(GL_UNPACK_ALIGNMENT, 4);
	// finish up
	proxy.hash = fileHash;
	proxy.atlasSize = dims;
	proxy.path = path;
	proxy.size = size;
	proxy.empty = false;
	proxy.atlas = atlas;

	nite::print("loaded font '"+filename+"' size: "+nite::toStr(size));

	// clean up
	if(thickness > 0.0f){
		FT_Stroker_Done(stroker);
	}
	FT_Done_Face(face);
	FT_Done_FreeType(library);
}